

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O1

void __thiscall
RigidBodyDynamics::ContactConstraint::calcConstraintForces
          (ContactConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,
          MatrixNd *GSys,VectorNd *LagrangeMultipliersSys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodiesUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          ConstraintCache *cache,bool resolveAllInRootFrame,bool updateKinematics)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  ConstraintCache *pCVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  double dVar4;
  pointer puVar5;
  pointer pSVar6;
  pointer pSVar7;
  long lVar8;
  double dVar9;
  undefined8 uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ActualDstType actualDst;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ActualDstType actualDst_1;
  Matrix3d *pMVar21;
  ConstraintCache *pCVar22;
  byte bVar23;
  double dVar24;
  Matrix3d local_78;
  
  bVar23 = 0;
  __x = &(this->super_Constraint).bodyIds;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(constraintBodiesUpd,__x);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator=(&constraintBodyFramesUpd->
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ,&(this->super_Constraint).bodyFrames.
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             );
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_78,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x60) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x50) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x58) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  if (resolveAllInRootFrame) {
    puVar5 = (constraintBodiesUpd->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *puVar5 = puVar5[1];
    pSVar6 = (constraintBodyFramesUpd->
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ).
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar24 = *(double *)(cache + 0x58);
    *(undefined8 *)
     &(pSVar6->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
         *(undefined8 *)(cache + 0x50);
    *(double *)((long)&(pSVar6->r).super_Vector3d + 8) = dVar24;
    *(double *)((long)&(pSVar6->r).super_Vector3d + 0x10) = *(double *)(cache + 0x60);
    pSVar6 = (constraintBodyFramesUpd->
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ).
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar24 = *(double *)((long)&pSVar6[1].E.super_Matrix3d + 8);
    dVar4 = *(double *)((long)&pSVar6[1].E.super_Matrix3d + 0x10);
    dVar9 = *(double *)((long)&pSVar6[1].E.super_Matrix3d + 0x18);
    dVar12 = *(double *)((long)&pSVar6[1].E.super_Matrix3d + 0x20);
    dVar13 = *(double *)((long)&pSVar6[1].E.super_Matrix3d + 0x28);
    dVar14 = *(double *)((long)&pSVar6[1].E.super_Matrix3d + 0x30);
    dVar15 = *(double *)((long)&pSVar6[1].E.super_Matrix3d + 0x38);
    *(undefined8 *)&(pSVar6->E).super_Matrix3d = *(undefined8 *)&pSVar6[1].E.super_Matrix3d;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 8) = dVar24;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 0x10) = dVar4;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 0x18) = dVar9;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 0x20) = dVar12;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 0x28) = dVar13;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 0x30) = dVar14;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 0x38) = dVar15;
    *(double *)((long)&(pSVar6->E).super_Matrix3d + 0x40) =
         *(double *)((long)&pSVar6[1].E.super_Matrix3d + 0x40);
  }
  pCVar1 = cache + 0x50;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            (&constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             (long)(this->super_Constraint).bodyIds.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Constraint).bodyIds.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  lVar16 = (long)(this->super_Constraint).bodyIds.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_Constraint).bodyIds.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar16 != 0) {
    pSVar7 = (constraintForcesUpd->
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar19 = 1;
    uVar18 = 0;
    do {
      pdVar17 = (double *)
                ((long)&pSVar7[uVar18].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar17 = 0.0;
      pdVar17[1] = 0.0;
      pdVar17 = (double *)
                ((long)&pSVar7[uVar18].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar17 = 0.0;
      pdVar17[1] = 0.0;
      *(undefined8 *)
       &pSVar7[uVar18].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar7[uVar18].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      uVar18 = (ulong)uVar19;
      uVar19 = uVar19 + 1;
    } while (uVar18 < (ulong)(lVar16 >> 2));
  }
  *(double *)pCVar1 = 0.0;
  *(undefined8 *)(cache + 0x58) = 0;
  *(undefined8 *)(cache + 0x60) = 0;
  if ((this->super_Constraint).sizeOfConstraint != 0) {
    dVar24 = *(double *)(cache + 0x60);
    lVar16 = 0x10;
    uVar18 = 0;
    do {
      lVar8 = *(long *)&(this->super_Constraint).field_0xd8;
      dVar4 = (LagrangeMultipliersSys->
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [(this->super_Constraint).rowInSystem + (int)uVar18];
      pdVar17 = (double *)(lVar8 + -0x10 + lVar16);
      dVar9 = pdVar17[1];
      *(double *)(cache + 0x50) = dVar4 * *pdVar17 + *(double *)(cache + 0x50);
      *(double *)(cache + 0x58) = dVar4 * dVar9 + *(double *)(cache + 0x58);
      dVar24 = dVar24 + dVar4 * *(double *)(lVar8 + lVar16);
      *(double *)(cache + 0x60) = dVar24;
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 0x18;
    } while (uVar18 < (this->super_Constraint).sizeOfConstraint);
  }
  if (resolveAllInRootFrame) {
    pdVar17 = (double *)
              ((long)&(((constraintForcesUpd->
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    if (((ulong)pdVar17 & 7) == 0) {
      uVar18 = (ulong)pdVar17 >> 3;
      uVar19 = (uint)uVar18 & 1;
      if ((uVar18 & 1) != 0) {
        *pdVar17 = *(double *)pCVar1;
      }
      uVar20 = (ulong)(uVar19 * 8);
      uVar10 = *(undefined8 *)(pCVar1 + uVar20 + 8);
      puVar2 = (undefined8 *)((long)pdVar17 + uVar20);
      *puVar2 = *(undefined8 *)(pCVar1 + uVar20);
      puVar2[1] = uVar10;
      if ((uVar18 & 1) == 0) {
        uVar18 = (ulong)((uVar19 | 2) << 3);
        *(undefined8 *)((long)pdVar17 + uVar18) = *(undefined8 *)(pCVar1 + uVar18);
      }
    }
    else {
      lVar16 = 0;
      do {
        pdVar17[lVar16] = *(double *)(pCVar1 + lVar16 * 8);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
    }
  }
  else {
    CalcBodyWorldOrientation
              (&local_78,model,Q,
               *(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,false);
    pMVar21 = &local_78;
    pCVar22 = cache + 0xe0;
    for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
      *(double *)pCVar22 =
           (pMVar21->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pMVar21 = (Matrix3d *)((long)pMVar21 + ((ulong)bVar23 * -2 + 1) * 8);
      pCVar22 = pCVar22 + (ulong)bVar23 * -0x10 + 8;
    }
    pSVar7 = (constraintForcesUpd->
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar17 = (double *)
              ((long)&(pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    dVar24 = *(double *)(cache + 0x60);
    dVar4 = *(double *)(cache + 0x50);
    dVar9 = *(double *)(cache + 0x58);
    local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[0] =
         dVar9 * *(double *)(cache + 0xf8) + dVar4 * *(double *)(cache + 0xe0) +
         dVar24 * *(double *)(cache + 0x110);
    local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[1] =
         dVar9 * *(double *)(cache + 0x100) + dVar4 * *(double *)(cache + 0xe8) +
         dVar24 * *(double *)(cache + 0x118);
    dVar24 = *(double *)(cache + 0x108) * dVar9 + dVar24 * *(double *)(cache + 0x120) +
             *(double *)(cache + 0xf0) * dVar4;
    if (((ulong)pdVar17 & 7) == 0) {
      uVar18 = (ulong)(((uint)((ulong)pdVar17 >> 3) & 1) << 3);
      if (((uint)pdVar17 >> 3 & 1) != 0) {
        *pdVar17 = local_78.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
      }
      local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
      .m_data.array[2] = dVar24;
      memcpy((void *)((long)pdVar17 + uVar18),
             (void *)((long)local_78.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + uVar18),0x10);
      if (((ulong)pdVar17 >> 3 & 1) == 0) {
        *(double *)
         ((long)&(pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = dVar24;
      }
    }
    else {
      *(double *)
       ((long)&(pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = dVar24;
      *pdVar17 = local_78.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [0];
      *(double *)
       ((long)&(pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) =
           local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[1];
    }
  }
  pdVar17 = (double *)
            ((long)&(constraintForcesUpd->
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
  if (((ulong)pdVar17 & 7) == 0) {
    uVar18 = (ulong)pdVar17 >> 3;
    uVar19 = (uint)uVar18 & 1;
    if ((uVar18 & 1) != 0) {
      *pdVar17 = -*(double *)pCVar1;
    }
    uVar20 = (ulong)(uVar19 * 8);
    pCVar22 = pCVar1 + uVar20;
    uVar11 = *(uint *)(pCVar22 + 4);
    uVar10 = *(undefined8 *)(pCVar22 + 8);
    puVar3 = (undefined4 *)((long)pdVar17 + uVar20);
    *puVar3 = *(undefined4 *)pCVar22;
    puVar3[1] = uVar11 ^ 0x80000000;
    puVar3[2] = (int)uVar10;
    puVar3[3] = (uint)((ulong)uVar10 >> 0x20) ^ 0x80000000;
    if ((uVar18 & 1) == 0) {
      uVar18 = (ulong)((uVar19 | 2) << 3);
      *(ulong *)((long)pdVar17 + uVar18) = *(ulong *)(pCVar1 + uVar18) ^ 0x8000000000000000;
    }
  }
  else {
    lVar16 = 0;
    do {
      pdVar17[lVar16] = -*(double *)(pCVar1 + lVar16 * 8);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
  }
  return;
}

Assistant:

void ContactConstraint::calcConstraintForces( 
              Model &model,
              const double time,
              const Math::VectorNd &Q,
              const Math::VectorNd &QDot,
              const Math::MatrixNd &GSys,
              const Math::VectorNd &LagrangeMultipliersSys,
              std::vector< unsigned int > &constraintBodiesUpd,
              std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
              std::vector< Math::SpatialVector > &constraintForcesUpd,
              ConstraintCache &cache,
              bool resolveAllInRootFrame,
              bool updateKinematics)
{

  //Size the vectors of bodies, local frames, and spatial vectors
  constraintBodiesUpd       = bodyIds;
  constraintBodyFramesUpd   = bodyFrames;

  cache.vec3A = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                    updateKinematics);

  if(resolveAllInRootFrame){
    constraintBodiesUpd[0] = constraintBodiesUpd[1];
    constraintBodyFramesUpd[0].r = cache.vec3A;
    constraintBodyFramesUpd[0].E = constraintBodyFramesUpd[1].E;
  }


  constraintForcesUpd.resize(bodyIds.size());
  for(unsigned int i=0; i< bodyIds.size(); ++i){
    constraintForcesUpd[i].setZero();
  }
  //Evaluate the total force the constraint applies to the contact point
  cache.vec3A.setZero();
  for(unsigned int i=0; i < sizeOfConstraint; ++i){
    //The only reason that we can use T here is that it is resolved
    //at the origin of the ground frame.
    cache.vec3A += T[i]*LagrangeMultipliersSys[rowInSystem+i];
  }

  //Update the forces applied to the body in the frame of the body
  if(resolveAllInRootFrame){
    constraintForcesUpd[0].block(3,0,3,1) = cache.vec3A;
  }else{
    cache.mat3A = CalcBodyWorldOrientation(model,Q,bodyIds[0],false);
    constraintForcesUpd[0].block(3,0,3,1) = cache.mat3A*cache.vec3A;
  }

  //Update the forces applied to the ground in the frame of the ground
  constraintForcesUpd[1].block(3,0,3,1) = -cache.vec3A;
}